

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu_Impl.cpp
# Opt level: O1

blip_time_t __thiscall Vgm_Emu_Impl::run_commands(Vgm_Emu_Impl *this,vgm_time_t end_time)

{
  Ym_Emu<Ym2612_Emu> *this_00;
  byte bVar1;
  sample_t_conflict1 *psVar2;
  int iVar3;
  long lVar4;
  size_t __n;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  byte *pbVar8;
  int vgm_time;
  uint uVar9;
  
  vgm_time = this->vgm_time;
  pbVar8 = this->pos;
  pbVar7 = this->data_end;
  if ((pbVar7 <= pbVar8) &&
     ((this->super_Classic_Emu).super_Music_Emu.emu_track_ended_ = true, pbVar7 < pbVar8)) {
    (this->super_Classic_Emu).super_Music_Emu.super_Gme_File.warning_ = "Stream lacked end event";
  }
  if ((vgm_time < end_time) && (pbVar8 < this->data_end)) {
    this_00 = &this->ym2612;
    pbVar7 = pbVar8;
    do {
      pbVar8 = pbVar7 + 1;
      bVar1 = *pbVar7;
      uVar9 = (uint)bVar1;
      switch(bVar1) {
      case 0x4f:
        pbVar8 = pbVar7 + 2;
        Sms_Apu::write_ggstereo(&this->psg,this->blip_time_factor * vgm_time >> 0xc,(uint)pbVar7[1])
        ;
        break;
      case 0x50:
        pbVar8 = pbVar7 + 2;
        Sms_Apu::write_data(&this->psg,this->blip_time_factor * vgm_time >> 0xc,(uint)pbVar7[1]);
        break;
      case 0x51:
        uVar9 = (this->ym2413).last_time;
        __n = (size_t)uVar9;
        iVar3 = (int)((ulong)((long)vgm_time * (long)this->fm_time_factor + this->fm_time_offset) >>
                     0xc);
        iVar5 = iVar3 - uVar9;
        if (iVar5 != 0 && (int)uVar9 <= iVar3) {
          if ((int)uVar9 < 0) goto LAB_006bd436;
          (this->ym2413).last_time = iVar3;
          psVar2 = (this->ym2413).out;
          (this->ym2413).out = psVar2 + (uint)(iVar5 * 2);
          Ym2413_Emu::run(&(this->ym2413).super_Ym2413_Emu,iVar5,psVar2);
        }
        Ym2413_Emu::write(&(this->ym2413).super_Ym2413_Emu,(uint)pbVar7[1],(void *)(ulong)pbVar7[2],
                          __n);
        goto LAB_006bd436;
      case 0x52:
        if (*pbVar8 == 0x2a) {
          write_pcm(this,vgm_time,(uint)pbVar7[2]);
        }
        else {
          iVar3 = (this->ym2612).last_time;
          iVar5 = (int)((ulong)((long)vgm_time * (long)this->fm_time_factor + this->fm_time_offset)
                       >> 0xc);
          iVar6 = iVar5 - iVar3;
          if (iVar6 != 0 && iVar3 <= iVar5) {
            if (iVar3 < 0) goto LAB_006bd436;
            (this->ym2612).last_time = iVar5;
            psVar2 = (this->ym2612).out;
            (this->ym2612).out = psVar2 + (uint)(iVar6 * 2);
            Ym2612_Emu::run(&this_00->super_Ym2612_Emu,iVar6,psVar2);
          }
          if (*pbVar8 == 0x2b) {
            uVar9 = (pbVar7[2] >> 7) - 1;
            this->dac_disabled = uVar9;
            this->dac_amp = this->dac_amp | uVar9;
          }
          Ym2612_Emu::write0(&this_00->super_Ym2612_Emu,(uint)pbVar7[1],(uint)pbVar7[2]);
        }
        goto LAB_006bd436;
      case 0x53:
        iVar3 = (this->ym2612).last_time;
        iVar5 = (int)((ulong)((long)vgm_time * (long)this->fm_time_factor + this->fm_time_offset) >>
                     0xc);
        iVar6 = iVar5 - iVar3;
        if (iVar6 != 0 && iVar3 <= iVar5) {
          if (iVar3 < 0) goto LAB_006bd436;
          (this->ym2612).last_time = iVar5;
          psVar2 = (this->ym2612).out;
          (this->ym2612).out = psVar2 + (uint)(iVar6 * 2);
          Ym2612_Emu::run(&this_00->super_Ym2612_Emu,iVar6,psVar2);
        }
        Ym2612_Emu::write1(&this_00->super_Ym2612_Emu,(uint)pbVar7[1],(uint)pbVar7[2]);
LAB_006bd436:
        pbVar8 = pbVar7 + 3;
        break;
      case 0x54:
      case 0x55:
      case 0x56:
      case 0x57:
      case 0x58:
      case 0x59:
      case 0x5a:
      case 0x5b:
      case 0x5c:
      case 0x5d:
      case 0x5e:
      case 0x5f:
      case 0x60:
      case 0x65:
switchD_006bd155_caseD_54:
        if ((bVar1 & 0xf0) == 0x50) goto LAB_006bd239;
        if ((uVar9 & 0xfffffff0) == 0x70) {
          vgm_time = vgm_time + (uVar9 & 0xf) + 1;
        }
        else if ((uVar9 & 0xfffffff0) == 0x80) {
          pbVar7 = this->pcm_pos;
          this->pcm_pos = pbVar7 + 1;
          write_pcm(this,vgm_time,(uint)*pbVar7);
          vgm_time = (uVar9 & 0xf) + vgm_time;
        }
        else {
          uVar9 = (bVar1 >> 4) - 3;
          lVar4 = 1;
          if (uVar9 < 0xd) {
            lVar4 = *(long *)(&DAT_007729d0 + (ulong)uVar9 * 8);
          }
          pbVar8 = pbVar8 + lVar4 + -1;
          (this->super_Classic_Emu).super_Music_Emu.super_Gme_File.warning_ = "Unknown stream event"
          ;
        }
        break;
      case 0x61:
        vgm_time = vgm_time + (uint)*(ushort *)(pbVar7 + 1);
LAB_006bd239:
        pbVar8 = pbVar7 + 3;
        break;
      case 0x62:
        vgm_time = vgm_time + 0x2df;
        break;
      case 99:
        vgm_time = vgm_time + 0x372;
        break;
      case 100:
        pbVar8 = pbVar7 + 2;
        vgm_time = vgm_time + (uint)pbVar7[1];
        break;
      case 0x66:
        pbVar8 = this->loop_begin;
        break;
      case 0x67:
        uVar9 = *(uint *)(pbVar7 + 3);
        if (pbVar7[2] == 0) {
          this->pcm_data = pbVar7 + 7;
        }
        pbVar8 = pbVar7 + 7 + uVar9;
        break;
      default:
        if (uVar9 != 0xe0) goto switchD_006bd155_caseD_54;
        this->pcm_pos =
             this->pcm_data +
             (ulong)pbVar7[1] + (ulong)pbVar7[2] * 0x100 + (ulong)pbVar7[3] * 0x10000 +
             (ulong)pbVar7[4] * 0x1000000;
        pbVar8 = pbVar7 + 5;
      }
    } while ((vgm_time < end_time) && (pbVar7 = pbVar8, pbVar8 < this->data_end));
  }
  this->pos = pbVar8;
  this->vgm_time = vgm_time - end_time;
  return end_time * this->blip_time_factor >> 0xc;
}

Assistant:

blip_time_t Vgm_Emu_Impl::run_commands( vgm_time_t end_time )
{
	vgm_time_t vgm_time = this->vgm_time; 
	byte const* pos = this->pos;
	if ( pos >= data_end )
	{
		set_track_ended();
		if ( pos > data_end )
			set_warning( "Stream lacked end event" );
	}
	
	while ( vgm_time < end_time && pos < data_end )
	{
		// TODO: be sure there are enough bytes left in stream for particular command
		// so we don't read past end
		switch ( *pos++ )
		{
		case cmd_end:
			pos = loop_begin; // if not looped, loop_begin == data_end
			break;
		
		case cmd_delay_735:
			vgm_time += 735;
			break;
		
		case cmd_delay_882:
			vgm_time += 882;
			break;
		
		case cmd_gg_stereo:
			psg.write_ggstereo( to_blip_time( vgm_time ), *pos++ );
			break;
		
		case cmd_psg:
			psg.write_data( to_blip_time( vgm_time ), *pos++ );
			break;
		
		case cmd_delay:
			vgm_time += pos [1] * 0x100L + pos [0];
			pos += 2;
			break;
		
		case cmd_byte_delay:
			vgm_time += *pos++;
			break;
		
		case cmd_ym2413:
			if ( ym2413.run_until( to_fm_time( vgm_time ) ) )
				ym2413.write( pos [0], pos [1] );
			pos += 2;
			break;
		
		case cmd_ym2612_port0:
			if ( pos [0] == ym2612_dac_port )
			{
				write_pcm( vgm_time, pos [1] );
			}
			else if ( ym2612.run_until( to_fm_time( vgm_time ) ) )
			{
				if ( pos [0] == 0x2B )
				{
					dac_disabled = (pos [1] >> 7 & 1) - 1;
					dac_amp |= dac_disabled;
				}
				ym2612.write0( pos [0], pos [1] );
			}
			pos += 2;
			break;
		
		case cmd_ym2612_port1:
			if ( ym2612.run_until( to_fm_time( vgm_time ) ) )
				ym2612.write1( pos [0], pos [1] );
			pos += 2;
			break;
			
		case cmd_data_block: {
			check( *pos == cmd_end );
			int type = pos [1];
			long size = get_le32( pos + 2 );
			pos += 6;
			if ( type == pcm_block_type )
				pcm_data = pos;
			pos += size;
			break;
		}
		
		case cmd_pcm_seek:
			pcm_pos = pcm_data + pos [3] * 0x1000000L + pos [2] * 0x10000L +
					pos [1] * 0x100L + pos [0];
			pos += 4;
			break;
		
		default:
			int cmd = pos [-1];
			switch ( cmd & 0xF0 )
			{
				case cmd_pcm_delay:
					write_pcm( vgm_time, *pcm_pos++ );
					vgm_time += cmd & 0x0F;
					break;
				
				case cmd_short_delay:
					vgm_time += (cmd & 0x0F) + 1;
					break;
				
				case 0x50:
					pos += 2;
					break;
				
				default:
					pos += command_len( cmd ) - 1;
					set_warning( "Unknown stream event" );
			}
		}
	}
	vgm_time -= end_time;
	this->pos = pos;
	this->vgm_time = vgm_time;
	
	return to_blip_time( end_time );
}